

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

HSQUIRRELVM sq_open(SQInteger initialstacksize)

{
  bool bVar1;
  SQSharedState *this;
  SQVM *v;
  SQSharedState *ss;
  SQInteger initialstacksize_local;
  
  this = (SQSharedState *)sq_vm_malloc(0x180);
  SQSharedState::SQSharedState(this);
  SQSharedState::Init(this);
  initialstacksize_local = (SQInteger)sq_vm_malloc(0x158);
  SQVM::SQVM((SQVM *)initialstacksize_local,this);
  SQObjectPtr::operator=(&this->_root_vm,(SQVM *)initialstacksize_local);
  bVar1 = SQVM::Init((SQVM *)initialstacksize_local,(SQVM *)0x0,initialstacksize);
  if (!bVar1) {
    (**(((SQVM *)initialstacksize_local)->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted
    )();
    sq_vm_free((void *)initialstacksize_local,0x158);
    initialstacksize_local = 0;
  }
  return (HSQUIRRELVM)initialstacksize_local;
}

Assistant:

HSQUIRRELVM sq_open(SQInteger initialstacksize)
{
    SQSharedState *ss;
    SQVM *v;
    sq_new(ss, SQSharedState);
    ss->Init();
    v = (SQVM *)SQ_MALLOC(sizeof(SQVM));
    new (v) SQVM(ss);
    ss->_root_vm = v;
    if(v->Init(NULL, initialstacksize)) {
        return v;
    } else {
        sq_delete(v, SQVM);
        return NULL;
    }
    return v;
}